

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cg.c
# Opt level: O0

void * cod_extract_state(cod_exec_context ec,int *length_p)

{
  long lVar1;
  void *__dest;
  undefined4 *in_RSI;
  long in_RDI;
  void *ret;
  cod_code code;
  
  lVar1 = *(long *)(in_RDI + 0x10);
  __dest = malloc((long)*(int *)(lVar1 + 0x20));
  memcpy(__dest,*(void **)(in_RDI + 8),(long)*(int *)(lVar1 + 0x20));
  *in_RSI = *(undefined4 *)(lVar1 + 0x20);
  return __dest;
}

Assistant:

extern void *cod_extract_state(cod_exec_context ec, int *length_p)
{
    cod_code code = ec->gen_code;
    void *ret = malloc(code->static_size_required);
    /*    
    int i;
    printf("Static block size is %d\n", code->static_size_required);
    for (i=0; i < code->static_size_required; i++) {
	printf(" %02x", ((unsigned char*)ec->static_data)[i]);
    }
    printf("\n");*/
    memcpy(ret, ec->static_data, code->static_size_required);
    *length_p = code->static_size_required;
    /*    *ioformats = code->static_formats;*/
    
    return ret;
}